

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
  sVar1;
  uint uVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
  *psVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  lVar3 = *state;
  uVar2 = *(uint *)(this + 8);
  if (uVar2 == 0) {
    uVar10 = 0;
  }
  else {
    psVar6 = (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
              *)*state;
    sVar1 = *this;
    iVar11 = (int)psVar6;
    uVar9 = 0;
    do {
      if (psVar6 == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
                     *)state[4]) {
        *(undefined1 *)((long)state + 0x31) = 1;
        uVar10 = (int)(simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
                       *)state[4] - iVar11;
        break;
      }
      uVar10 = uVar9;
      if (*psVar6 == sVar1) break;
      psVar6 = psVar6 + 1;
      *state = (long)psVar6;
      uVar9 = uVar9 + 1;
      uVar10 = uVar2;
    } while (uVar2 != uVar9);
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<true>>>,mpl_::bool_<true>>
       )0x1) {
    lVar5 = (ulong)(state[4] != lVar3) + lVar3;
    lVar7 = lVar5;
    if (uVar10 < *(uint *)(this + 8)) {
      lVar7 = *state;
    }
    if (uVar10 != 0) {
      lVar5 = lVar7;
    }
    state[0x12] = lVar5;
  }
  if (uVar10 < *(uint *)(this + 4)) {
LAB_001313d0:
    *state = lVar3;
    bVar8 = false;
  }
  else {
    cVar4 = (**(code **)(*next + 0x10))(next,state);
    bVar8 = true;
    if (cVar4 == '\0') {
      iVar11 = uVar10 + 1;
      do {
        iVar11 = iVar11 + -1;
        if (iVar11 == *(int *)(this + 4)) goto LAB_001313d0;
        *state = *state + -1;
        cVar4 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar4 == '\0');
    }
  }
  return bVar8;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }